

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

void __thiscall nite::Polygon::rectangle(Polygon *this,float w,float h)

{
  Vec2 local_38;
  Vec2 local_30;
  Vec2 local_28;
  Vec2 local_20;
  float local_18;
  float local_14;
  float h_local;
  float w_local;
  Polygon *this_local;
  
  local_18 = h;
  local_14 = w;
  _h_local = this;
  clear(this);
  Vec2::set(&this->origin,local_14 * 0.5,local_18 * 0.5);
  Vec2::Vec2(&local_20,0.0,0.0);
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::push_back(&this->vert,&local_20);
  Vec2::Vec2(&local_28,local_14,0.0);
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::push_back(&this->vert,&local_28);
  Vec2::Vec2(&local_30,local_14,local_18);
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::push_back(&this->vert,&local_30);
  Vec2::Vec2(&local_38,0.0,local_18);
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::push_back(&this->vert,&local_38);
  return;
}

Assistant:

void nite::Polygon::rectangle(float w, float h){
	clear();
	origin.set(w * 0.5f, h * 0.5f);
	vert.push_back(nite::Vec2(0, 0));
	vert.push_back(nite::Vec2(w, 0));
	vert.push_back(nite::Vec2(w, h));
	vert.push_back(nite::Vec2(0, h));
}